

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_che.c
# Opt level: O1

void beltCHEStepG_internal(void *state)

{
  u64 *dest;
  word *c;
  long lVar1;
  
  lVar1 = *(long *)((long)state + 0x90);
  if (lVar1 == 0) {
    memCopy((void *)((long)state + 0x50),(void *)((long)state + 0x40),0x10);
  }
  else {
    memSet((void *)((long)state + lVar1 + 0x70),'\0',0x10 - lVar1);
    dest = (u64 *)((long)state + 0x50);
    u64From(dest,(void *)((long)state + 0x70),0x10);
    *(uint *)((long)state + 0x50) = *(uint *)((long)state + 0x50) ^ *(uint *)((long)state + 0x40);
    *(uint *)((long)state + 0x54) = *(uint *)((long)state + 0x54) ^ *(uint *)((long)state + 0x44);
    *(uint *)((long)state + 0x58) = *(uint *)((long)state + 0x58) ^ *(uint *)((long)state + 0x48);
    *(uint *)((long)state + 0x5c) = *(uint *)((long)state + 0x5c) ^ *(uint *)((long)state + 0x4c);
    beltPolyMul(dest,dest,(word *)((long)state + 0x30),(void *)((long)state + 0xa0));
  }
  c = (word *)((long)state + 0x50);
  *(uint *)((long)state + 0x50) = *(uint *)((long)state + 0x60) ^ *(uint *)((long)state + 0x50);
  *(uint *)((long)state + 0x54) = *(uint *)((long)state + 100) ^ *(uint *)((long)state + 0x54);
  *(uint *)((long)state + 0x58) = *(uint *)((long)state + 0x68) ^ *(uint *)((long)state + 0x58);
  *(uint *)((long)state + 0x5c) = *(uint *)((long)state + 0x6c) ^ *(uint *)((long)state + 0x5c);
  beltPolyMul(c,c,(word *)((long)state + 0x30),(void *)((long)state + 0xa0));
  beltBlockEncr((octet *)c,(u32 *)state);
  return;
}

Assistant:

static void beltCHEStepG_internal(void* state)
{
	belt_che_st* st = (belt_che_st*)state;
	ASSERT(memIsValid(state, beltCHE_keep()));
	// создать копию t и завершить обработку данных
	if (st->filled)
	{
		memSetZero(st->block + st->filled, 16 - st->filled);
		wwFrom(st->t1, st->block, 16);
		beltBlockXor2(st->t1, st->t);
		beltPolyMul(st->t1, st->t1, st->r, st->stack);
	}
	else
		memCopy(st->t1, st->t, 16);
	// обработать блок длины
	beltBlockXor2(st->t1, st->len);
	beltPolyMul(st->t1, st->t1, st->r, st->stack);
#if (OCTET_ORDER == BIG_ENDIAN)
	beltBlockRevW(st->t1);
#endif
	beltBlockEncr((octet*)st->t1, st->key);
}